

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReusableStringStream::ReusableStringStream(ReusableStringStream *this)

{
  size_t sVar1;
  StringStreams *this_00;
  reference this_01;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type *in_RDI;
  StringStreams *in_stack_00000018;
  
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable();
  sVar1 = StringStreams::add(in_stack_00000018);
  *in_RDI = sVar1;
  this_00 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable
                      ();
  this_01 = std::
            vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this_00->m_streams,*in_RDI);
  pbVar2 = Detail::
           unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(this_01);
  in_RDI[1] = (size_type)pbVar2;
  return;
}

Assistant:

ReusableStringStream::ReusableStringStream()
    :   m_index( Singleton<StringStreams>::getMutable().add() ),
        m_oss( Singleton<StringStreams>::getMutable().m_streams[m_index].get() )
    {}